

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_in_array(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pNeedle;
  jx9_value *pRight;
  uint uVar1;
  int iVar2;
  int in_ECX;
  jx9_hashmap_node **ppNode;
  
  ppNode = (jx9_hashmap_node **)0x0;
  uVar1 = 0;
  if (1 < nArg) {
    pNeedle = *apArg;
    if (nArg != 2) {
      uVar1 = jx9_value_to_bool(apArg[2]);
      ppNode = (jx9_hashmap_node **)(ulong)uVar1;
    }
    pRight = apArg[1];
    if ((pRight->iFlags & 0x40) == 0) {
      iVar2 = jx9_value_compare(pNeedle,pRight,(int)ppNode);
    }
    else {
      iVar2 = HashmapFindValue((jx9_hashmap *)(pRight->x).pOther,pNeedle,ppNode,in_ECX);
    }
    uVar1 = (uint)(iVar2 == 0);
  }
  jx9_result_bool(pCtx,uVar1);
  return 0;
}

Assistant:

static int jx9_hashmap_in_array(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pNeedle;
	int bStrict;
	int rc;
	if( nArg < 2 ){
		/* Missing argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pNeedle = apArg[0];
	bStrict = 0;
	if( nArg > 2 ){
		bStrict = jx9_value_to_bool(apArg[2]);
	}
	if( !jx9_value_is_json_array(apArg[1]) ){
		/* haystack must be an array, perform a standard comparison */ 
		rc = jx9_value_compare(pNeedle, apArg[1], bStrict);
		/* Set the comparison result */
		jx9_result_bool(pCtx, rc == 0);
		return JX9_OK;
	}
	/* Perform the lookup */
	rc = HashmapFindValue((jx9_hashmap *)apArg[1]->x.pOther, pNeedle, 0, bStrict);
	/* Lookup result */
	jx9_result_bool(pCtx, rc == SXRET_OK);
	return JX9_OK;
}